

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::KeywordTypeSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if ((((((kind == CHandleType) || (kind == EventType)) || (kind == PropertyType)) ||
       ((kind - RealTimeType < 2 || (kind == SequenceType)))) ||
      ((kind == ShortRealType || ((kind == StringType || (kind == Untyped)))))) ||
     (kind == VoidType)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool KeywordTypeSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::CHandleType:
        case SyntaxKind::EventType:
        case SyntaxKind::PropertyType:
        case SyntaxKind::RealTimeType:
        case SyntaxKind::RealType:
        case SyntaxKind::SequenceType:
        case SyntaxKind::ShortRealType:
        case SyntaxKind::StringType:
        case SyntaxKind::Untyped:
        case SyntaxKind::VoidType:
            return true;
        default:
            return false;
    }
}